

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

int av1_compound_single_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MV *this_mv,uint8_t *second_pred,
              uint8_t *mask,int mask_stride,int *rate_mv,int ref_idx)

{
  undefined8 *puVar1;
  uint8_t uVar2;
  char cVar3;
  bool bVar4;
  uint8_t *puVar5;
  undefined8 uVar6;
  uint8_t *puVar7;
  undefined8 uVar8;
  buf_2d *pbVar9;
  BLOCK_SIZE bsize_00;
  SEARCH_METHODS search_method;
  uint num_planes;
  FULLPEL_MV start_mv;
  int iVar10;
  int iVar11;
  search_site_config *search_sites;
  undefined7 in_register_00000011;
  buf_2d *pbVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int_mv best_mv;
  int_mv ref_mv;
  long local_298;
  int_mv *local_290;
  uint local_284;
  uint8_t *local_280;
  uint8_t *local_278;
  MACROBLOCKD *local_270;
  ulong local_268;
  YV12_BUFFER_CONFIG *local_260;
  MvCosts *local_258;
  uint sse;
  int dis;
  FULLPEL_MV_STATS best_mv_stats;
  buf_2d orig_yv12;
  buf_2d backup_yv12 [3];
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  
  local_298 = CONCAT44(local_298._4_4_,(int)CONCAT71(in_register_00000011,bsize));
  lVar15 = (long)ref_idx;
  uVar2 = ((cpi->common).seq_params)->monochrome;
  cVar3 = (*(x->e_mbd).mi)->ref_frame[lVar15];
  local_290 = (int_mv *)this_mv;
  local_280 = second_pred;
  local_278 = mask;
  ref_mv = av1_get_ref_mv(x,ref_idx);
  local_258 = x->mv_costs;
  local_260 = av1_get_scaled_ref_frame(cpi,(int)cVar3);
  num_planes = (uint)(uVar2 == '\0') * 2 + 1;
  if (lVar15 != 0) {
    orig_yv12.buf = (x->e_mbd).plane[0].pre[0].buf;
    orig_yv12.buf0 = (x->e_mbd).plane[0].pre[0].buf0;
    orig_yv12.width = (x->e_mbd).plane[0].pre[0].width;
    orig_yv12.height = (x->e_mbd).plane[0].pre[0].height;
    orig_yv12.stride = (x->e_mbd).plane[0].pre[0].stride;
    orig_yv12._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c;
    pbVar12 = (x->e_mbd).plane[0].pre + lVar15;
    puVar5 = pbVar12->buf0;
    pbVar9 = (x->e_mbd).plane[0].pre + lVar15;
    iVar10 = pbVar9->width;
    iVar11 = pbVar9->height;
    uVar6 = *(undefined8 *)(&pbVar9->width + 2);
    (x->e_mbd).plane[0].pre[0].buf = pbVar12->buf;
    (x->e_mbd).plane[0].pre[0].buf0 = puVar5;
    (x->e_mbd).plane[0].pre[0].width = iVar10;
    (x->e_mbd).plane[0].pre[0].height = iVar11;
    *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uVar6;
  }
  if (local_260 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar12 = backup_yv12;
    for (lVar13 = 0; (ulong)num_planes * 0xa30 - lVar13 != 0; lVar13 = lVar13 + 0xa30) {
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[lVar15].buf + lVar13);
      puVar5 = (uint8_t *)*puVar1;
      puVar7 = (uint8_t *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[lVar15].width + lVar13);
      uVar6 = *puVar1;
      uVar8 = puVar1[1];
      pbVar12->width = (int)uVar6;
      pbVar12->height = (int)((ulong)uVar6 >> 0x20);
      *(undefined8 *)&pbVar12->stride = uVar8;
      pbVar12->buf = puVar5;
      pbVar12->buf0 = puVar7;
      pbVar12 = pbVar12 + 1;
    }
    av1_setup_pre_planes
              (&x->e_mbd,0,local_260,(x->e_mbd).mi_row,(x->e_mbd).mi_col,(scale_factors *)0x0,
               num_planes);
  }
  bsize_00 = (BLOCK_SIZE)local_298;
  uVar14 = (uint)(BLOCK_SIZE)local_298;
  local_270 = &x->e_mbd;
  local_268 = (ulong)num_planes;
  search_method = av1_get_default_mv_search_method(x,&(cpi->sf).mv_sf,(BLOCK_SIZE)local_298);
  search_sites = av1_get_search_site_config(cpi,x,search_method);
  start_mv = get_fullmv_from_mv(&local_290->as_mv);
  local_284 = uVar14;
  av1_make_default_fullpel_ms_params
            (&full_ms_params,cpi,x,bsize_00,&ref_mv.as_mv,start_mv,search_sites,search_method,0);
  full_ms_params.ms_buffers.second_pred = local_280;
  full_ms_params.ms_buffers.mask = local_278;
  full_ms_params.ms_buffers.mask_stride = mask_stride;
  full_ms_params.ms_buffers.inv_mask = ref_idx;
  local_298 = lVar15;
  iVar10 = av1_full_pixel_search
                     (start_mv,&full_ms_params,5,(int *)0x0,&best_mv.as_fullmv,&best_mv_stats,
                      (FULLPEL_MV *)0x0);
  if (local_260 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar12 = backup_yv12;
    for (lVar15 = 0; local_268 * 0xa30 - lVar15 != 0; lVar15 = lVar15 + 0xa30) {
      puVar5 = pbVar12->buf;
      puVar7 = pbVar12->buf0;
      uVar6 = *(undefined8 *)&pbVar12->stride;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].width + lVar15);
      *puVar1 = *(undefined8 *)&pbVar12->width;
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + lVar15);
      *puVar1 = puVar5;
      puVar1[1] = puVar7;
      pbVar12 = pbVar12 + 1;
    }
  }
  bVar4 = (cpi->common).features.cur_frame_force_integer_mv;
  if (bVar4 == true) {
    convert_fullmv_to_mv(&best_mv);
  }
  iVar11 = 0x7fffffff;
  if ((iVar10 != 0x7fffffff) && (iVar11 = iVar10, bVar4 == false)) {
    av1_make_default_subpel_ms_params
              (&ms_params,cpi,x,(BLOCK_SIZE)local_284,&ref_mv.as_mv,(int *)0x0);
    ms_params.var_params.ms_buffers.second_pred = local_280;
    ms_params.var_params.ms_buffers.mask = local_278;
    ms_params.var_params.ms_buffers.mask_stride = mask_stride;
    ms_params.var_params.ms_buffers.inv_mask = (int)local_298;
    ms_params.forced_stop = '\0';
    iVar11 = (*(cpi->mv_search_params).find_fractional_mv_step)
                       (local_270,&cpi->common,&ms_params,
                        (MV)((best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8),
                        &best_mv_stats,(MV *)&best_mv,&dis,&sse,(int_mv *)0x0);
  }
  if ((int)local_298 != 0) {
    (x->e_mbd).plane[0].pre[0].width = orig_yv12.width;
    (x->e_mbd).plane[0].pre[0].height = orig_yv12.height;
    (x->e_mbd).plane[0].pre[0].stride = orig_yv12.stride;
    *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = orig_yv12._28_4_;
    (x->e_mbd).plane[0].pre[0].buf = orig_yv12.buf;
    (x->e_mbd).plane[0].pre[0].buf0 = orig_yv12.buf0;
  }
  if (iVar11 != 0x7fffffff) {
    *local_290 = best_mv;
  }
  *rate_mv = 0;
  iVar10 = av1_mv_bit_cost(&local_290->as_mv,&ref_mv.as_mv,local_258->nmv_joint_cost,
                           local_258->mv_cost_stack,0x6c);
  *rate_mv = *rate_mv + iVar10;
  return iVar11;
}

Assistant:

int av1_compound_single_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                                      BLOCK_SIZE bsize, MV *this_mv,
                                      const uint8_t *second_pred,
                                      const uint8_t *mask, int mask_stride,
                                      int *rate_mv, int ref_idx) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int ref = mbmi->ref_frame[ref_idx];
  const int_mv ref_mv = av1_get_ref_mv(x, ref_idx);
  struct macroblockd_plane *const pd = &xd->plane[0];
  const MvCosts *mv_costs = x->mv_costs;

  struct buf_2d backup_yv12[MAX_MB_PLANE];
  const YV12_BUFFER_CONFIG *const scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);

  // Check that this is either an interinter or an interintra block
  assert(has_second_ref(mbmi) || (ref_idx == 0 && is_interintra_mode(mbmi)));

  // Store the first prediction buffer.
  struct buf_2d orig_yv12;
  if (ref_idx) {
    orig_yv12 = pd->pre[0];
    pd->pre[0] = pd->pre[ref_idx];
  }

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    // The index below needs to be 0 instead of ref_idx since we assume the
    // 0th slot to be used for subsequent searches. Note that the ref_idx
    // reference buffer has been copied to the 0th slot in the code above.
    // Now we need to swap the reference frame for the 0th slot.
    av1_setup_pre_planes(xd, 0, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  int bestsme = INT_MAX;
  int_mv best_mv;

  // Make motion search params
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  FULLPEL_MV_STATS best_mv_stats;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, &cpi->sf.mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  // Use the mv result from the single mode as mv predictor.
  const FULLPEL_MV start_fullmv = get_fullmv_from_mv(this_mv);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                     &ref_mv.as_mv, start_fullmv,
                                     src_search_sites, search_method,
                                     /*fine_search_interval=*/0);

  av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                           mask_stride, ref_idx);

  // Small-range full-pixel motion search.
  bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search for the 0th slot.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = backup_yv12[i];
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(&best_mv);
  }
  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  if (use_fractional_mv) {
    int dis; /* TODO: use dis in distortion calculation later. */
    unsigned int sse;
    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv.as_mv,
                                      NULL);
    av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                             mask, mask_stride, ref_idx);
    ms_params.forced_stop = EIGHTH_PEL;
    MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
    bestsme = cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, start_mv, &best_mv_stats, &best_mv.as_mv, &dis,
        &sse, NULL);
  }

  // Restore the pointer to the first unscaled prediction buffer.
  if (ref_idx) pd->pre[0] = orig_yv12;

  if (bestsme < INT_MAX) *this_mv = best_mv.as_mv;

  *rate_mv = 0;

  *rate_mv += av1_mv_bit_cost(this_mv, &ref_mv.as_mv, mv_costs->nmv_joint_cost,
                              mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  return bestsme;
}